

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O2

void __thiscall zmq::stream_engine_base_t::timer_event(stream_engine_base_t *this,int id_)

{
  if (id_ == 0x82) {
    this->_has_ttl_timer = false;
  }
  else {
    if (id_ == 0x80) {
      this->_next_msg = 0x89;
      *(undefined8 *)&this->field_0x550 = 0;
      (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[3])(this);
      io_object_t::add_timer(&this->super_io_object_t,(this->_options).heartbeat_interval,0x80);
      return;
    }
    if (id_ == 0x81) {
      this->_has_timeout_timer = false;
    }
    else {
      if (id_ != 0x40) {
        return;
      }
      this->_has_handshake_timer = false;
    }
  }
  (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,2);
  return;
}

Assistant:

void zmq::stream_engine_base_t::timer_event (int id_)
{
    if (id_ == handshake_timer_id) {
        _has_handshake_timer = false;
        //  handshake timer expired before handshake completed, so engine fail
        error (timeout_error);
    } else if (id_ == heartbeat_ivl_timer_id) {
        _next_msg = &stream_engine_base_t::produce_ping_message;
        out_event ();
        add_timer (_options.heartbeat_interval, heartbeat_ivl_timer_id);
    } else if (id_ == heartbeat_ttl_timer_id) {
        _has_ttl_timer = false;
        error (timeout_error);
    } else if (id_ == heartbeat_timeout_timer_id) {
        _has_timeout_timer = false;
        error (timeout_error);
    } else
        // There are no other valid timer ids!
        assert (false);
}